

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::build
          (BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this)

{
  uint uVar1;
  
  uVar1 = *(uint *)&this->mesh->field_0x7c;
  if (this->topologyVersion < uVar1) {
    this->topologyVersion = uVar1;
    (**(code **)((long)(((this->builder)._M_t.
                         super___uniq_ptr_impl<embree::Builder,_std::default_delete<embree::Builder>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::Builder_*,_std::default_delete<embree::Builder>_>
                         .super__Head_base<0UL,_embree::Builder_*,_false>._M_head_impl)->
                       super_RefCount)._vptr_RefCount + 0x20))();
    return;
  }
  BVHNRefitter<4>::refit
            ((this->refitter)._M_t.
             super___uniq_ptr_impl<embree::avx::BVHNRefitter<4>,_std::default_delete<embree::avx::BVHNRefitter<4>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::avx::BVHNRefitter<4>_*,_std::default_delete<embree::avx::BVHNRefitter<4>_>_>
             .super__Head_base<0UL,_embree::avx::BVHNRefitter<4>_*,_false>._M_head_impl);
  return;
}

Assistant:

void BVHNRefitT<N,Mesh,Primitive>::build()
    {
      if (mesh->topologyChanged(topologyVersion)) {
        topologyVersion = mesh->getTopologyVersion();
        builder->build();
      }
      else
        refitter->refit();
    }